

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O1

void ncnn::convdw3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  undefined1 auVar16 [32];
  long lVar17;
  uint *puVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong *puVar22;
  long lVar23;
  long lVar24;
  ulong *puVar25;
  uint uVar26;
  float *pfVar27;
  float *pfVar28;
  int iVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  
  iVar5 = bottom_blob->c;
  if (0 < (long)iVar5) {
    iVar6 = top_blob->w;
    uVar7 = top_blob->h;
    pvVar8 = _kernel->data;
    pvVar9 = _bias->data;
    lVar23 = (long)bottom_blob->w;
    sVar10 = top_blob->cstep;
    sVar11 = top_blob->elemsize;
    pvVar12 = top_blob->data;
    sVar13 = bottom_blob->cstep;
    sVar14 = bottom_blob->elemsize;
    pvVar15 = bottom_blob->data;
    lVar1 = lVar23 + 2;
    lVar21 = 0;
    do {
      if (pvVar9 == (void *)0x0) {
        fVar30 = 0.0;
      }
      else {
        fVar30 = *(float *)((long)pvVar9 + lVar21 * 4);
      }
      pfVar27 = (float *)(sVar10 * sVar11 * lVar21 + (long)pvVar12);
      puVar22 = (ulong *)(sVar13 * sVar14 * lVar21 + (long)pvVar15);
      lVar17 = lVar21 * 0x24;
      puVar18 = (uint *)((long)puVar22 + lVar23 * 4);
      puVar25 = puVar22 + lVar23;
      pfVar28 = pfVar27;
      uVar26 = 0;
      if (1 < (int)uVar7) {
        lVar24 = (long)puVar22 + lVar23 * 0xc;
        iVar19 = 0;
        do {
          pfVar27 = pfVar27 + iVar6;
          if (0 < iVar6) {
            lVar20 = 0;
            iVar29 = iVar6 + 1;
            do {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)((long)puVar22 + lVar20 + 4);
              auVar33 = vmovlhps_avx(ZEXT416(*(uint *)((long)puVar22 + lVar20)),auVar31);
              auVar33 = vshufps_avx(auVar33,auVar31,0xd8);
              auVar34 = vinsertps_avx(auVar33,ZEXT416((uint)*(float *)((long)puVar18 + lVar20)),0x30
                                     );
              pfVar2 = (float *)((long)pvVar8 + lVar17 + 0x10);
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)((long)puVar18 + lVar20 + 4);
              auVar33 = vinsertps_avx(auVar39,ZEXT416(*(uint *)((long)puVar25 + lVar20)),0x20);
              auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)((long)puVar25 + lVar20 + 4)),0x30);
              auVar41._0_4_ = *pfVar2 * auVar33._0_4_;
              auVar41._4_4_ = pfVar2[1] * auVar33._4_4_;
              auVar41._8_4_ = pfVar2[2] * auVar33._8_4_;
              auVar41._12_4_ = pfVar2[3] * auVar33._12_4_;
              auVar31 = vhaddps_avx(auVar41,auVar41);
              auVar33 = *(undefined1 (*) [16])((long)pvVar8 + lVar17);
              auVar31 = vhaddps_avx(auVar31,auVar31);
              auVar36._0_4_ = auVar33._0_4_ * auVar34._0_4_;
              auVar36._4_4_ = auVar33._4_4_ * auVar34._4_4_;
              auVar36._8_4_ = auVar33._8_4_ * auVar34._8_4_;
              auVar36._12_4_ = auVar33._12_4_ * auVar34._12_4_;
              auVar34 = vhaddps_avx(auVar36,auVar36);
              fVar3 = *(float *)((long)pvVar8 + lVar17 + 0x20);
              auVar34 = vhaddps_avx(auVar34,auVar34);
              auVar36 = vmovlhps_avx(auVar33,auVar39);
              auVar36 = vshufps_avx(auVar36,auVar39,0xd8);
              auVar39 = vinsertps_avx(auVar36,ZEXT416(*(uint *)((long)puVar25 + lVar20)),0x30);
              auVar40._8_8_ = 0;
              auVar40._0_8_ = *(ulong *)((long)puVar25 + lVar20 + 4);
              auVar36 = vmovhps_avx(auVar40,*(undefined8 *)(lVar24 + lVar20));
              fVar4 = *(float *)(lVar24 + 8 + lVar20);
              auVar38._0_4_ = auVar36._0_4_ * *pfVar2;
              auVar38._4_4_ = auVar36._4_4_ * pfVar2[1];
              auVar38._8_4_ = auVar36._8_4_ * pfVar2[2];
              auVar38._12_4_ = auVar36._12_4_ * pfVar2[3];
              auVar36 = vhaddps_avx(auVar38,auVar38);
              auVar36 = vhaddps_avx(auVar36,auVar36);
              auVar32._0_4_ = auVar39._0_4_ * *(float *)((long)puVar18 + lVar20);
              auVar32._4_4_ = auVar39._4_4_ * auVar33._4_4_;
              auVar32._8_4_ = auVar39._8_4_ * auVar33._8_4_;
              auVar32._12_4_ = auVar39._12_4_ * auVar33._12_4_;
              auVar33 = vhaddps_avx(auVar32,auVar32);
              auVar33 = vhaddps_avx(auVar33,auVar33);
              *(float *)((long)pfVar28 + lVar20) =
                   auVar31._0_4_ +
                   fVar3 * *(float *)((long)puVar25 + lVar20 + 8) + auVar34._0_4_ + fVar30;
              *(float *)((long)pfVar27 + lVar20) =
                   fVar3 * fVar4 + auVar36._0_4_ + auVar33._0_4_ + fVar30;
              lVar20 = lVar20 + 4;
              iVar29 = iVar29 + -1;
            } while (1 < iVar29);
            pfVar28 = (float *)((long)pfVar28 + lVar20);
            pfVar27 = (float *)((long)pfVar27 + lVar20);
            puVar22 = (ulong *)((long)puVar22 + lVar20);
            puVar18 = (uint *)((long)puVar18 + lVar20);
            puVar25 = (ulong *)((long)puVar25 + lVar20);
            lVar24 = lVar24 + lVar20;
          }
          puVar22 = (ulong *)((long)puVar22 + lVar1 * 4);
          puVar18 = puVar18 + lVar1;
          puVar25 = (ulong *)((long)puVar25 + lVar1 * 4);
          lVar24 = lVar24 + lVar1 * 4;
          pfVar28 = pfVar28 + iVar6;
          iVar29 = iVar19 + 3;
          iVar19 = iVar19 + 2;
          uVar26 = uVar7 & 0xfffffffe;
        } while (iVar29 < (int)uVar7);
      }
      if ((int)uVar26 < (int)uVar7) {
        do {
          iVar19 = iVar6 + 1;
          if (0 < iVar6) {
            do {
              auVar33._8_8_ = 0;
              auVar33._0_8_ = *puVar22;
              auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)puVar22[1]),0x20);
              auVar33 = vinsertps_avx(auVar33,ZEXT416(*puVar18),0x30);
              auVar37._16_8_ = *(undefined8 *)(puVar18 + 1);
              auVar37._0_16_ = auVar33;
              auVar37._24_8_ = 0;
              auVar35._16_8_ = *puVar25;
              auVar35._0_16_ = auVar33;
              auVar35._24_8_ = 0;
              auVar35 = vshufpd_avx(auVar37,auVar35,2);
              pfVar27 = (float *)((long)pvVar8 + lVar17);
              auVar34._0_4_ = auVar35._0_4_ * *pfVar27;
              auVar34._4_4_ = auVar35._4_4_ * pfVar27[1];
              auVar34._8_4_ = auVar35._8_4_ * pfVar27[2];
              auVar34._12_4_ = auVar35._12_4_ * pfVar27[3];
              auVar16._16_4_ = auVar35._16_4_ * pfVar27[4];
              auVar16._0_16_ = auVar34;
              auVar16._20_4_ = auVar35._20_4_ * pfVar27[5];
              auVar16._24_4_ = auVar35._24_4_ * pfVar27[6];
              auVar16._28_4_ = auVar35._28_4_;
              pfVar27 = (float *)(puVar25 + 1);
              auVar33 = vhaddps_avx(auVar16._16_16_,auVar34);
              auVar33 = vhaddps_avx(auVar33,auVar33);
              puVar22 = (ulong *)((long)puVar22 + 4);
              auVar33 = vhaddps_avx(auVar33,auVar33);
              puVar18 = puVar18 + 1;
              puVar25 = (ulong *)((long)puVar25 + 4);
              *pfVar28 = *(float *)((long)pvVar8 + lVar17 + 0x20) * *pfVar27 + fVar30 +
                         auVar33._0_4_;
              pfVar28 = pfVar28 + 1;
              iVar19 = iVar19 + -1;
            } while (1 < iVar19);
          }
          puVar22 = puVar22 + 1;
          puVar18 = puVar18 + 2;
          puVar25 = puVar25 + 1;
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar7);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != iVar5);
  }
  return;
}

Assistant:

static void convdw3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g * 9;

        float* outptr = out;
        float* outptr2 = outptr + outw;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w * 2;
        const float* r3 = img0 + w * 3;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i + 1 < outh; i += 2)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                float sum2 = bias0;
                sum2 += r1[0] * k0[0];
                sum2 += r1[1] * k0[1];
                sum2 += r1[2] * k0[2];
                sum2 += r2[0] * k1[0];
                sum2 += r2[1] * k1[1];
                sum2 += r2[2] * k1[2];
                sum2 += r3[0] * k2[0];
                sum2 += r3[1] * k2[1];
                sum2 += r3[2] * k2[2];

                *outptr = sum;
                *outptr2 = sum2;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
                outptr2++;
            }

            r0 += 2 + w;
            r1 += 2 + w;
            r2 += 2 + w;
            r3 += 2 + w;

            outptr += outw;
            outptr2 += outw;
        }

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}